

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

StringPtr kj::operator*(ulong param_1)

{
  char *__s;
  size_t sVar1;
  StringPtr SVar2;
  
  __s = operator*::TYPE_STRINGS[param_1 & 0xffffffff];
  sVar1 = strlen(__s);
  SVar2.content.size_ = sVar1 + 1;
  SVar2.content.ptr = __s;
  return (StringPtr)SVar2.content;
}

Assistant:

StringPtr KJ_STRINGIFY(Exception::Type type) {
  static const char* TYPE_STRINGS[] = {
    "failed",
    "overloaded",
    "disconnected",
    "unimplemented"
  };

  return TYPE_STRINGS[static_cast<uint>(type)];
}